

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O3

uint32_t tohandle(skynet_context *context,char *param)

{
  uint32_t uVar1;
  ulong uVar2;
  
  if (*param != '.') {
    if (*param == ':') {
      uVar2 = strtoul(param + 1,(char **)0x0,0x10);
      uVar1 = (uint32_t)uVar2;
    }
    else {
      uVar1 = 0;
      skynet_error(context,"Can\'t convert %s to handle");
    }
    return uVar1;
  }
  uVar1 = skynet_handle_findname(param + 1);
  return uVar1;
}

Assistant:

static uint32_t
tohandle(struct skynet_context * context, const char * param) {
	uint32_t handle = 0;
	if (param[0] == ':') {
		handle = strtoul(param+1, NULL, 16);
	} else if (param[0] == '.') {
		handle = skynet_handle_findname(param+1);
	} else {
		skynet_error(context, "Can't convert %s to handle",param);
	}

	return handle;
}